

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lalr.c
# Opt level: O2

void traverse(int i)

{
  uint uVar1;
  uint *puVar2;
  Yshort *pYVar3;
  Yshort *pYVar4;
  int iVar5;
  long lVar6;
  uint *puVar7;
  uint *puVar8;
  int iVar9;
  uint *puVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  
  pYVar4 = VERTICES;
  lVar6 = (long)top;
  iVar9 = top + 1;
  top = iVar9;
  VERTICES[lVar6 + 1] = i;
  pYVar3 = INDEX;
  lVar11 = (long)i;
  INDEX[lVar11] = iVar9;
  puVar2 = F;
  lVar6 = (long)tokensetsize;
  puVar10 = F + lVar6 * lVar11;
  piVar12 = R[lVar11];
  if (piVar12 != (int *)0x0) {
    while( true ) {
      lVar13 = (long)*piVar12;
      if (lVar13 < 0) break;
      iVar5 = pYVar3[lVar13];
      if (iVar5 == 0) {
        traverse(*piVar12);
        iVar5 = pYVar3[lVar13];
      }
      if (iVar5 < pYVar3[lVar11]) {
        pYVar3[lVar11] = iVar5;
      }
      piVar12 = piVar12 + 1;
      puVar7 = puVar2 + tokensetsize * lVar13;
      for (puVar8 = puVar10; puVar8 < puVar10 + lVar6; puVar8 = puVar8 + 1) {
        uVar1 = *puVar7;
        puVar7 = puVar7 + 1;
        *puVar8 = *puVar8 | uVar1;
      }
    }
    if (pYVar3[lVar11] != iVar9) {
      return;
    }
  }
  iVar9 = infinity;
  lVar11 = (long)top;
  while( true ) {
    iVar5 = pYVar4[lVar11];
    lVar11 = lVar11 + -1;
    pYVar3[iVar5] = iVar9;
    if (iVar5 == i) break;
    puVar7 = puVar2 + (long)tokensetsize * (long)iVar5;
    for (puVar8 = puVar10; puVar8 < puVar10 + lVar6; puVar8 = puVar8 + 1) {
      *puVar7 = *puVar8;
      puVar7 = puVar7 + 1;
    }
  }
  top = (int)lVar11;
  return;
}

Assistant:

void traverse(int i)
{
  register unsigned *fp1;
  register unsigned *fp2;
  register unsigned *fp3;
  register int j;
  register Yshort *rp;

  int height;
  unsigned *base;

  VERTICES[++top] = i;
  INDEX[i] = height = top;

  base = F + i * tokensetsize;
  fp3 = base + tokensetsize;

  rp = R[i];
  if (rp)
    {
      while ((j = *rp++) >= 0)
	{
	  if (INDEX[j] == 0)
	    traverse(j);

	  if (INDEX[i] > INDEX[j])
	    INDEX[i] = INDEX[j];

	  fp1 = base;
	  fp2 = F + j * tokensetsize;

	  while (fp1 < fp3)
	    *fp1++ |= *fp2++;
	}
    }

  if (INDEX[i] == height)
    {
      for (;;)
	{
	  j = VERTICES[top--];
	  INDEX[j] = infinity;

	  if (i == j)
	    break;

	  fp1 = base;
	  fp2 = F + j * tokensetsize;

	  while (fp1 < fp3)
	    *fp2++ = *fp1++;
	}
    }
}